

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_list * __thiscall
mjs::parser::parse_argument_list(expression_list *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  char *__addr_len;
  token local_d8;
  undefined1 local_b0 [40];
  undefined1 local_88 [24];
  undefined1 local_70 [96];
  parser *this_local;
  expression_list *l;
  
  __addr_len = "parse_argument_list";
  local_70._88_8_ = this;
  this_local = (parser *)__return_storage_ptr__;
  expect((token *)(local_70 + 0x30),this,lparen,"parse_argument_list",0x27b);
  token::~token((token *)(local_70 + 0x30));
  local_70[0x2f] = 0;
  std::
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  ::vector(__return_storage_ptr__);
  accept((parser *)local_70,(int)this,(sockaddr *)0x2f,(socklen_t *)__addr_len);
  bVar1 = token::operator_cast_to_bool((token *)local_70);
  token::~token((token *)local_70);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    do {
      parse_assignment_expression((parser *)local_88);
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_88);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_88);
      accept((parser *)local_b0,(int)this,(sockaddr *)0x20,(socklen_t *)__addr_len);
      bVar1 = token::operator_cast_to_bool((token *)local_b0);
      token::~token((token *)local_b0);
    } while (bVar1);
    expect(&local_d8,this,rparen,"parse_argument_list",0x281);
    token::~token(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

expression_list parse_argument_list() {
        EXPECT(token_type::lparen);
        expression_list l;
        if (!accept(token_type::rparen)) {
            do {
                l.push_back(parse_assignment_expression());
            } while (accept(token_type::comma));
            EXPECT(token_type::rparen);
        }
        return l;
    }